

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O3

int __thiscall Matrix::nSize(Matrix *this,int n)

{
  int iVar1;
  ostream *poVar2;
  
  if (n < this->nMatrixDimension) {
    iVar1 = this->pSize[n];
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Matrix::nSize(int): int (",0x19);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,n);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,") larger than number of dimensions.",0x23);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int Matrix::nSize(int n)
{
	if( n>=nMatrixDimension ) {
		cout << "Matrix::nSize(int): int ("
			<< n
			<< ") larger than number of dimensions." << endl;
		return -1;
	}
	return pSize[n];
}